

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

my_time get_current_sys_time(void)

{
  tm *ptVar1;
  undefined4 extraout_EDX;
  my_time mVar2;
  tm *ptm;
  time_t local_20;
  time_t tt;
  my_time t;
  
  ptm = (tm *)std::chrono::_V2::system_clock::now();
  local_20 = std::chrono::_V2::system_clock::to_time_t((time_point *)&ptm);
  ptVar1 = localtime(&local_20);
  mVar2.year = ptVar1->tm_year + 0x76c;
  mVar2.month = (char)ptVar1->tm_mon + '\x01';
  mVar2.day = (char)ptVar1->tm_mday;
  mVar2.hour = (char)ptVar1->tm_hour;
  mVar2.minute = (char)ptVar1->tm_min;
  mVar2._9_3_ = (undefined3)((uint)extraout_EDX >> 8);
  mVar2.second = (char)ptVar1->tm_sec;
  return mVar2;
}

Assistant:

static my_time get_current_sys_time()
{
    auto tt = chrono::system_clock::to_time_t(chrono::system_clock::now());
    struct tm* ptm = localtime(&tt);
    my_time t = { ptm->tm_year + 1900, static_cast<char>(ptm->tm_mon + 1), static_cast<char>(ptm->tm_mday),
            static_cast<char>(ptm->tm_hour), static_cast<char>(ptm->tm_min), static_cast<char>(ptm->tm_sec)};
    return t;
}